

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::tree::Section::Section<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Section *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *position,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end,long *lineNumber)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = *(undefined8 *)(head->super_StructureDivision).tail.fields._M_elems;
  uStack_40 = 0;
  iVar2 = (head->super_StructureDivision).tail.fields._M_elems[2];
  _Var3 = findEnd<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(position,end,lineNumber)
  ;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_68,begin._M_current,_Var3._M_current);
  this->mat_ = (undefined4)local_48;
  this->mf_ = local_48._4_4_;
  this->mt_ = iVar2;
  paVar1 = &(this->content_).field_2;
  (this->content_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_68 == &local_58) {
    paVar1->_M_allocated_capacity = local_58;
    *(undefined8 *)((long)&(this->content_).field_2 + 8) = uStack_50;
  }
  else {
    (this->content_)._M_dataplus._M_p = (pointer)local_68;
    (this->content_).field_2._M_allocated_capacity = local_58;
  }
  (this->content_)._M_string_length = local_60;
  return;
}

Assistant:

Section( const HEAD& head, BufferIterator begin,
         BufferIterator& position, const BufferIterator& end,
         long& lineNumber )
  try: Section( head.MAT(), head.MF(), head.MT(),
                std::string( begin, findEnd( position, end, lineNumber ) ) ) {}
  catch( std::exception& e ) {

    Log::info( "Trouble encountered while constructing an ENDF tree section" );
    Log::info( "Current position: MAT{} MF{} MT{} at line {}",
               head.MAT(), head.MF(), head.MT(), lineNumber );
    throw e;
  }